

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_object(cJSON *item,int depth,int fmt,printbuffer *p)

{
  char *__s;
  int iVar1;
  int iVar2;
  cJSON *pcVar3;
  char *pcVar4;
  void *__s_00;
  void *__s_01;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  int fmt_00;
  uint needed;
  cJSON **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong __n;
  size_t __n_00;
  int iVar14;
  int local_58;
  
  __n = (ulong)(uint)depth;
  ppcVar9 = &item->child;
  __n_00 = 0xfffffffffffffff8;
  uVar10 = 0;
  pcVar3 = (cJSON *)ppcVar9;
  do {
    pcVar3 = pcVar3->next;
    uVar10 = uVar10 - 1;
    __n_00 = __n_00 + 8;
  } while (pcVar3 != (cJSON *)0x0);
  if ((int)uVar10 == -1) {
    if (p == (printbuffer *)0x0) {
      iVar14 = 3;
      if (fmt != 0) {
        iVar14 = depth + 4;
      }
      pcVar4 = (char *)(*cJSON_malloc)((long)iVar14);
    }
    else {
      iVar14 = 3;
      if (fmt != 0) {
        iVar14 = depth + 4;
      }
      pcVar4 = ensure(p,iVar14);
    }
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '{';
      if (fmt == 0) {
        pcVar6 = pcVar4 + 1;
      }
      else {
        pcVar6 = pcVar4 + 2;
        pcVar4[1] = '\n';
        if (0 < depth) {
          memset(pcVar6,9,__n);
          pcVar6 = pcVar4 + __n + 2;
        }
      }
      pcVar6[0] = '}';
      pcVar6[1] = '\0';
      return pcVar4;
    }
  }
  else if (p == (printbuffer *)0x0) {
    __s_00 = (*cJSON_malloc)(__n_00);
    if (__s_00 != (void *)0x0) {
      __s_01 = (*cJSON_malloc)(__n_00);
      if (__s_01 != (void *)0x0) {
        uVar5 = ~uVar10;
        memset(__s_00,0,__n_00);
        memset(__s_01,0,__n_00);
        iVar14 = 7;
        if (fmt != 0) {
          iVar14 = depth + 8;
        }
        pcVar3 = *ppcVar9;
        if (pcVar3 != (cJSON *)0x0) {
          iVar12 = 2;
          if (fmt != 0) {
            iVar12 = depth + 5;
          }
          lVar13 = 0;
          do {
            pcVar4 = print_string_ptr(pcVar3->string,(printbuffer *)0x0);
            *(char **)((long)__s_01 + lVar13) = pcVar4;
            pcVar6 = print_value(pcVar3,depth + 1U,fmt,(printbuffer *)0x0);
            *(char **)((long)__s_00 + lVar13) = pcVar6;
            if ((pcVar4 == (char *)0x0) || (pcVar6 == (char *)0x0)) goto LAB_00104901;
            sVar8 = strlen(pcVar6);
            sVar7 = strlen(pcVar4);
            local_58 = (int)sVar8;
            iVar14 = iVar14 + iVar12 + (int)sVar7 + local_58;
            if (pcVar6 == (char *)0x0) break;
            lVar13 = lVar13 + 8;
            pcVar3 = pcVar3->next;
          } while (pcVar3 != (cJSON *)0x0);
        }
        pcVar4 = (char *)(*cJSON_malloc)((long)iVar14);
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '{';
          if (fmt == 0) {
            pcVar6 = pcVar4 + 1;
          }
          else {
            pcVar6 = pcVar4 + 2;
            pcVar4[1] = '\n';
          }
          *pcVar6 = '\0';
          uVar11 = 0;
          do {
            if (-1 < depth && fmt != 0) {
              memset(pcVar6,9,(ulong)(depth + 1U));
              pcVar6 = pcVar6 + __n + 1;
            }
            __s = *(char **)((long)__s_01 + uVar11 * 8);
            sVar8 = strlen(__s);
            memcpy(pcVar6,__s,sVar8);
            pcVar6[sVar8] = ':';
            if (fmt == 0) {
              lVar13 = sVar8 + 1;
            }
            else {
              pcVar6[sVar8 + 1] = '\t';
              lVar13 = sVar8 + 2;
            }
            strcpy(pcVar6 + lVar13,*(char **)((long)__s_00 + uVar11 * 8));
            sVar8 = strlen(*(char **)((long)__s_00 + uVar11 * 8));
            pcVar6 = pcVar6 + lVar13 + sVar8;
            if (-(int)uVar10 - 2 != uVar11) {
              *pcVar6 = ',';
              pcVar6 = pcVar6 + 1;
            }
            if (fmt != 0) {
              *pcVar6 = '\n';
              pcVar6 = pcVar6 + 1;
            }
            *pcVar6 = '\0';
            (*cJSON_free)(*(void **)((long)__s_01 + uVar11 * 8));
            (*cJSON_free)(*(void **)((long)__s_00 + uVar11 * 8));
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
          (*cJSON_free)(__s_01);
          (*cJSON_free)(__s_00);
          if (0 < depth && fmt != 0) {
            memset(pcVar6,9,__n);
            pcVar6 = pcVar6 + __n;
          }
          pcVar6[0] = '}';
          pcVar6[1] = '\0';
          return pcVar4;
        }
LAB_00104901:
        lVar13 = 0;
        do {
          if (*(void **)((long)__s_01 + lVar13) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_01 + lVar13));
          }
          if (*(void **)((long)__s_00 + lVar13) != (void *)0x0) {
            (*cJSON_free)(*(void **)((long)__s_00 + lVar13));
          }
          lVar13 = lVar13 + 8;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        (*cJSON_free)(__s_01);
      }
      (*cJSON_free)(__s_00);
    }
  }
  else {
    iVar14 = p->offset;
    pcVar4 = ensure(p,(fmt != 0) + 2);
    if (pcVar4 != (char *)0x0) {
      iVar12 = (fmt != 0) + 1;
      *pcVar4 = '{';
      if (fmt == 0) {
        pcVar4 = pcVar4 + 1;
      }
      else {
        pcVar4[1] = '\n';
        pcVar4 = pcVar4 + 2;
      }
      *pcVar4 = '\0';
      p->offset = p->offset + iVar12;
      pcVar3 = *ppcVar9;
      if (pcVar3 != (cJSON *)0x0) {
        needed = depth + 1;
        do {
          if (fmt != 0) {
            pcVar4 = ensure(p,needed);
            if (pcVar4 == (char *)0x0) {
              return (char *)0x0;
            }
            if (-1 < depth) {
              memset(pcVar4,9,(ulong)needed);
            }
            p->offset = p->offset + needed;
          }
          print_string_ptr(pcVar3->string,p);
          if (p->buffer == (char *)0x0) {
            iVar1 = 0;
          }
          else {
            iVar1 = p->offset;
            sVar8 = strlen(p->buffer + iVar1);
            iVar1 = (int)sVar8 + iVar1;
          }
          p->offset = iVar1;
          pcVar4 = ensure(p,iVar12);
          if (pcVar4 == (char *)0x0) {
            return (char *)0x0;
          }
          iVar1 = 0;
          *pcVar4 = ':';
          if (fmt == 0) {
            iVar2 = 1;
            fmt_00 = 0;
          }
          else {
            pcVar4[1] = '\t';
            iVar2 = 2;
            fmt_00 = fmt;
          }
          p->offset = p->offset + iVar2;
          print_value(pcVar3,needed,fmt_00,p);
          if (p->buffer != (char *)0x0) {
            iVar1 = p->offset;
            sVar8 = strlen(p->buffer + iVar1);
            iVar1 = (int)sVar8 + iVar1;
          }
          p->offset = iVar1;
          iVar1 = ((fmt != 0) + 1) - (uint)(pcVar3->next == (cJSON *)0x0);
          pcVar4 = ensure(p,iVar1 + 1);
          if (pcVar4 == (char *)0x0) {
            return (char *)0x0;
          }
          if (pcVar3->next != (cJSON *)0x0) {
            *pcVar4 = ',';
            pcVar4 = pcVar4 + 1;
          }
          if (fmt != 0) {
            *pcVar4 = '\n';
            pcVar4 = pcVar4 + 1;
          }
          *pcVar4 = '\0';
          p->offset = p->offset + iVar1;
          pcVar3 = pcVar3->next;
        } while (pcVar3 != (cJSON *)0x0);
      }
      iVar12 = 2;
      if (fmt != 0) {
        iVar12 = depth + 2;
      }
      pcVar4 = ensure(p,iVar12);
      if (pcVar4 != (char *)0x0) {
        if (fmt != 0) {
          if (depth < 1) {
            iVar14 = 0;
          }
          else {
            memset(pcVar4,9,__n);
            pcVar4 = pcVar4 + __n;
            iVar14 = depth;
          }
        }
        pcVar4[0] = '}';
        pcVar4[1] = '\0';
        return p->buffer + iVar14;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_object(cJSON *item,int depth,int fmt,printbuffer *p)
{
	char **entries=0,**names=0;
	char *out=0,*ptr,*ret,*str;int len=7,i=0,j;
	cJSON *child=item->child;
	int numentries=0,fail=0;
	size_t tmplen=0;
	/* Count the number of entries. */
	while (child) numentries++,child=child->next;
	/* Explicitly handle empty object case */
	if (!numentries)
	{
		if (p) out=ensure(p,fmt?depth+4:3);
		else	out=(char*)cJSON_malloc(fmt?depth+4:3);
		if (!out)	return 0;
		ptr=out;*ptr++='{';
		if (fmt) {*ptr++='\n';for (i=0;i<depth;i++) *ptr++='\t';}
		*ptr++='}';*ptr++=0;
		return out;
	}
	if (p)
	{
		/* Compose the output: */
		i=p->offset;
		len=fmt?2:1;	ptr=ensure(p,len+1);	if (!ptr) return 0;
		*ptr++='{';	if (fmt) *ptr++='\n';	*ptr=0;	p->offset+=len;
		child=item->child;depth++;
		while (child)
		{
			if (fmt)
			{
				ptr=ensure(p,depth);	if (!ptr) return 0;
				for (j=0;j<depth;j++) *ptr++='\t';
				p->offset+=depth;
			}
			print_string_ptr(child->string,p);
			p->offset=update(p);
			
			len=fmt?2:1;
			ptr=ensure(p,len);	if (!ptr) return 0;
			*ptr++=':';if (fmt) *ptr++='\t';
			p->offset+=len;
			
			print_value(child,depth,fmt,p);
			p->offset=update(p);

			len=(fmt?1:0)+(child->next?1:0);
			ptr=ensure(p,len+1); if (!ptr) return 0;
			if (child->next) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			p->offset+=len;
			child=child->next;
		}
		ptr=ensure(p,fmt?(depth+1):2);	 if (!ptr) return 0;
		if (fmt)	for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr=0;
		out=(p->buffer)+i;
	}
	else
	{
		/* Allocate space for the names and the objects */
		entries=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!entries) return 0;
		names=(char**)cJSON_malloc(numentries*sizeof(char*));
		if (!names) {cJSON_free(entries);return 0;}
		memset(entries,0,sizeof(char*)*numentries);
		memset(names,0,sizeof(char*)*numentries);

		/* Collect all the results into our arrays: */
		child=item->child;depth++;if (fmt) len+=depth;
		while (child && !fail)
		{
			names[i]=str=print_string_ptr(child->string,0);
			entries[i++]=ret=print_value(child,depth,fmt,0);
			if (str && ret) len+=strlen(ret)+strlen(str)+2+(fmt?2+depth:0); else fail=1;
			child=child->next;
		}
		
		/* Try to allocate the output string */
		if (!fail)	out=(char*)cJSON_malloc(len);
		if (!out) fail=1;

		/* Handle failure */
		if (fail)
		{
			for (i=0;i<numentries;i++) {if (names[i]) cJSON_free(names[i]);if (entries[i]) cJSON_free(entries[i]);}
			cJSON_free(names);cJSON_free(entries);
			return 0;
		}
		
		/* Compose the output: */
		*out='{';ptr=out+1;if (fmt)*ptr++='\n';*ptr=0;
		for (i=0;i<numentries;i++)
		{
			if (fmt) for (j=0;j<depth;j++) *ptr++='\t';
			tmplen=strlen(names[i]);memcpy(ptr,names[i],tmplen);ptr+=tmplen;
			*ptr++=':';if (fmt) *ptr++='\t';
			strcpy(ptr,entries[i]);ptr+=strlen(entries[i]);
			if (i!=numentries-1) *ptr++=',';
			if (fmt) *ptr++='\n';*ptr=0;
			cJSON_free(names[i]);cJSON_free(entries[i]);
		}
		
		cJSON_free(names);cJSON_free(entries);
		if (fmt) for (i=0;i<depth-1;i++) *ptr++='\t';
		*ptr++='}';*ptr++=0;
	}
	return out;	
}